

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::CallExpression::createSystemCall
          (CallExpression *this,Compilation *compilation,SystemSubroutine *subroutine,
          Expression *firstArg,InvocationExpressionSyntax *syntax,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,SourceRange range,ASTContext *context,
          Scope *randomizeScope)

{
  pointer ppEVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte *pbVar4;
  undefined4 uVar6;
  PropertyExprSyntax *initialExpr;
  pointer ppEVar5;
  uint uVar7;
  ushort uVar8;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined1 auVar9 [16];
  char cVar10;
  bool bVar11;
  int iVar12;
  Type *pTVar13;
  Symbol *pSVar14;
  SyntaxNode *this_00;
  Diagnostic *pDVar15;
  undefined4 extraout_var;
  Expression *pEVar16;
  EmptyArgumentExpression *pEVar17;
  ExpressionSyntax *pEVar18;
  size_t sVar19;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CallExpression *this_01;
  SyntaxNode *pSVar20;
  SyntaxNode *pSVar21;
  SourceLocation SVar22;
  _Uninitialized<const_slang::ast::SubroutineSymbol_*,_true> _Var23;
  undefined4 extraout_var_02;
  socklen_t __len;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  ASTContext *argContext_00;
  Info *extraout_RDX_03;
  ulong pos0;
  char *pcVar25;
  long lVar26;
  long lVar27;
  DiagCode code;
  DiagCode code_00;
  Compilation *dst;
  ulong hash;
  byte *pbVar28;
  TokenOrSyntax *this_02;
  ulong uVar29;
  pointer ppEVar30;
  uint uVar31;
  char cVar32;
  char cVar33;
  byte bVar34;
  undefined1 auVar35 [16];
  SourceRange SVar36;
  undefined1 auVar37 [16];
  string_view sVar38;
  string_view arg;
  CallExpression *local_1f0;
  Expression *firstArg_local;
  string_view indexMethodName;
  anon_class_8_1_bc11688f getId;
  not_null<const_slang::ast::Type_*> local_1a0;
  Token iteratorTok;
  undefined1 local_178 [56];
  SourceLocation iteratorLoc;
  pointer local_138;
  string_view iteratorName;
  undefined1 local_118 [32];
  ASTContext argContext;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  CallExpression *pCVar24;
  
  local_78._8_8_ = *(undefined8 *)&(withClause->super_ExpressionSyntax).super_SyntaxNode;
  buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  local_68._0_8_ = (Expression *)0x0;
  local_68._8_8_ = (ValueSymbol *)0x0;
  local_68._16_16_ = (undefined1  [16])0x0;
  buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  firstArg_local = (Expression *)subroutine;
  local_78._0_8_ = compilation;
  if (subroutine != (SystemSubroutine *)0x0) {
    SmallVectorBase<slang::ast::Expression_const*>::
    emplace_back<slang::ast::Expression_const*const&>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,&firstArg_local);
  }
  if ((compilation->options).maxRecursiveClassSpecialization == 1) {
    if (syntax == (InvocationExpressionSyntax *)0x0) {
      if (((firstArg != (Expression *)0x0) &&
          (SVar22 = firstArg[1].sourceRange.endLoc, SVar22 != (SourceLocation)0x0)) &&
         (*(SyntaxNode **)((long)SVar22 + 0x58) != (SyntaxNode *)0x0)) {
        SVar36 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar22);
        pDVar15 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x680007,SVar36);
        Diagnostic::operator<<(pDVar15,(string *)&(compilation->super_BumpAllocator).endPtr);
        goto LAB_003c5c63;
      }
    }
    else if (firstArg_local != (Expression *)0x0) {
      pSVar21 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
      if (pSVar21 != (SyntaxNode *)0x0) {
        SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
        code.subsystem = Expressions;
        code.code = 0xa4;
LAB_003c5c56:
        ASTContext::addDiag((ASTContext *)withClause,code,SVar36);
LAB_003c5c63:
        pCVar24 = (CallExpression *)0x0;
LAB_003c5c65:
        this_01 = (CallExpression *)
                  Expression::badExpr((Compilation *)this,&pCVar24->super_Expression);
        goto LAB_003c5c70;
      }
      pSVar21 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
      if (pSVar21 == (SyntaxNode *)0x0) {
        SVar36 = parsing::Token::range((Token *)&syntax->attributes);
LAB_003c5c4e:
        code.subsystem = Expressions;
        code.code = 0x52;
        goto LAB_003c5c56;
      }
      if (((ulong)((long)&(pSVar21[3].previewNode)->kind + 1) & 0xfffffffffffffffe) != 2) {
        SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
        goto LAB_003c5c4e;
      }
      pbVar4 = (compilation->super_BumpAllocator).endPtr;
      uVar3 = (compilation->options).flags;
      uVar6 = (compilation->options).maxInstanceDepth;
      sVar38._M_len._4_4_ = uVar6;
      sVar38._M_len._0_4_ = uVar3;
      pTVar13 = (firstArg_local->type).ptr;
      iteratorLoc = (SourceLocation)0xffffffffffffffff;
      iteratorName._M_str = "item";
      iteratorName._M_len = 4;
      indexMethodName._M_str = "index";
      indexMethodName._M_len = 5;
      if (((firstArg != (Expression *)0x0) &&
          (SVar22 = firstArg[1].sourceRange.endLoc, SVar22 != (SourceLocation)0x0)) &&
         (*(SyntaxNode **)((long)SVar22 + 0x58) != (SyntaxNode *)0x0)) {
        pbVar28 = (byte *)((long)&(*(SyntaxNode **)((long)SVar22 + 0x58))->kind + 1);
        if (pbVar28 < (byte *)0x6) {
          pSVar21 = *(SyntaxNode **)((long)SVar22 + 0x50);
          getId.context = (ASTContext *)withClause;
          pSVar20 = slang::syntax::TokenOrSyntax::node((TokenOrSyntax *)pSVar21);
          iteratorTok = getIteratorParams::anon_class_8_1_bc11688f::operator()
                                  (&getId,(ArgumentSyntax *)pSVar20);
          if ((iteratorTok._0_4_ >> 0x10 & 1) == 0 && iteratorTok.info != (Info *)0x0) {
            if ((byte *)0x3 < pbVar28) {
              pSVar21 = pSVar21 + 2;
              pSVar20 = slang::syntax::TokenOrSyntax::node((TokenOrSyntax *)pSVar21);
              argContext._0_16_ =
                   getIteratorParams::anon_class_8_1_bc11688f::operator()
                             (&getId,(ArgumentSyntax *)pSVar20);
              if (((uint)argContext.scope.ptr >> 0x10 & 1) != 0 || argContext._8_8_ == (Info *)0x0)
              goto LAB_003c5c63;
              indexMethodName = parsing::Token::valueText((Token *)&argContext);
              iVar12 = *(int *)(**(long **)&(withClause->super_ExpressionSyntax).super_SyntaxNode +
                               0x48);
              if (iVar12 < 1) {
                pSVar21 = slang::syntax::TokenOrSyntax::node((TokenOrSyntax *)pSVar21);
                SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
                pDVar15 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x20001,SVar36);
                pcVar25 = "";
                if (iVar12 == 0) {
                  pcVar25 = "1800-2017";
                }
                arg._M_str = pcVar25;
                arg._M_len = (ulong)(iVar12 == 0) * 9;
                Diagnostic::operator<<(pDVar15,arg);
              }
            }
            iteratorName = parsing::Token::valueText(&iteratorTok);
            SVar22 = parsing::Token::location(&iteratorTok);
            iteratorLoc = SVar22;
            goto LAB_003c5e5f;
          }
        }
        else {
          SVar36 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar22);
          pDVar15 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0xa00007,SVar36);
          sVar38._M_str = (char *)pbVar4;
          Diagnostic::operator<<(pDVar15,sVar38);
          Diagnostic::operator<<<int>(pDVar15,2);
          Diagnostic::operator<<<unsigned_long>(pDVar15,(ulong)pbVar28 >> 1);
        }
        goto LAB_003c5c63;
      }
LAB_003c5e5f:
      _Var23._M_storage =
           (SubroutineSymbol *)
           BumpAllocator::
           emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&>
                     ((BumpAllocator *)this,
                      *(Scope **)&(withClause->super_ExpressionSyntax).super_SyntaxNode,
                      &iteratorName,&iteratorLoc,pTVar13,&indexMethodName);
      iteratorTok = *(Token *)&(withClause->super_ExpressionSyntax).super_SyntaxNode;
      local_178._8_8_ = (withClause->with).info;
      local_178._16_8_ = withClause->args;
      _Var23._M_storage[1].super_Symbol.originatingSyntax = *(SyntaxNode **)&withClause->with;
      local_178._0_8_ = _Var23._M_storage;
      pSVar21 = slang::syntax::TokenOrSyntax::node
                          ((TokenOrSyntax *)
                           (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent[3].
                           parent);
      iVar12 = Expression::bind((int)pSVar21,(sockaddr *)&iteratorTok,0);
      pCVar24 = (CallExpression *)CONCAT44(extraout_var_02,iVar12);
      bVar11 = Expression::bad((Expression *)pCVar24);
      if (bVar11) goto LAB_003c5c65;
      iteratorTok.info = (Info *)_Var23._M_storage;
      iteratorTok._0_8_ = pCVar24;
      std::
      variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
      ::operator=((variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                   *)local_68,(IteratorCallInfo *)&iteratorTok);
      local_1f0 = pCVar24;
      goto LAB_003c5994;
    }
    local_1f0 = (CallExpression *)0x0;
  }
  else {
    this_01 = (CallExpression *)&iteratorTok;
    ASTContext::RandomizeDetails::RandomizeDetails((RandomizeDetails *)this_01);
    pCVar24 = (CallExpression *)withClause;
    ASTContext::resetFlags(&argContext,(ASTContext *)withClause,(bitmask<slang::ast::ASTFlags>)0x0);
    if ((compilation->options).maxRecursiveClassSpecialization == 2) {
      argContext.randomizeDetails = (RandomizeDetails *)this_01;
      if (firstArg_local == (Expression *)0x0) {
        if ((context != (ASTContext *)0x0) && (**(int **)&context->lookupIndex == 0x16)) {
          iteratorTok._0_8_ = context;
        }
        goto LAB_003c547e;
      }
      pTVar13 = Type::getCanonicalType((firstArg_local->type).ptr);
      iteratorTok._0_8_ = pTVar13 + 1;
      pCVar24 = (CallExpression *)0x1;
      pSVar14 = Expression::getSymbolReference(firstArg_local,true);
      iteratorTok.info = (Info *)pSVar14;
      local_1f0 = (CallExpression *)firstArg_local;
      src = extraout_RDX_00;
    }
    else {
LAB_003c547e:
      local_1f0 = (CallExpression *)0x0;
      src = extraout_RDX;
    }
    if (syntax == (InvocationExpressionSyntax *)0x0) {
LAB_003c5796:
      if ((firstArg != (Expression *)0x0) &&
         (SVar22 = firstArg[1].sourceRange.endLoc, SVar22 != (SourceLocation)0x0)) {
        this_02 = *(TokenOrSyntax **)((long)SVar22 + 0x50);
        lVar27 = *(long *)((long)SVar22 + 0x58);
        for (uVar29 = 0; lVar27 + 1U >> 1 != uVar29; uVar29 = uVar29 + 1) {
          lVar26 = (uVar29 + 1) - (ulong)(firstArg_local == (Expression *)0x0);
          pSVar21 = slang::syntax::TokenOrSyntax::node(this_02);
          if (pSVar21->kind == EmptyArgument) {
            cVar10 = (*(code *)(compilation->super_BumpAllocator).head[1].prev)(compilation,lVar26);
            if (cVar10 == '\0') {
              pSVar21 = slang::syntax::TokenOrSyntax::node(this_02);
              SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
              code_00.subsystem = Expressions;
              code_00.code = 0x4d;
              goto LAB_003c5cc4;
            }
            pTVar13 = (Type *)this[2].thisClass_;
            pSVar21 = slang::syntax::TokenOrSyntax::node(this_02);
            iteratorName = (string_view)slang::syntax::SyntaxNode::sourceRange(pSVar21);
            pEVar17 = BumpAllocator::
                      emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                                ((BumpAllocator *)this,pTVar13,(SourceRange *)&iteratorName);
            indexMethodName._M_len = (size_t)pEVar17;
            pCVar24 = (CallExpression *)&indexMethodName;
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,
                       (Expression **)pCVar24);
          }
          else {
            if (pSVar21->kind != OrderedArgument) {
              pSVar21 = slang::syntax::TokenOrSyntax::node(this_02);
              SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
              code_00.subsystem = Expressions;
              code_00.code = 0x79;
LAB_003c5cc4:
              ASTContext::addDiag(&argContext,code_00,SVar36);
              pCVar24 = (CallExpression *)0x0;
              this_01 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0)
              ;
              goto LAB_003c570a;
            }
            this_01 = (CallExpression *)slang::syntax::TokenOrSyntax::node(this_02);
            initialExpr = (PropertyExprSyntax *)
                          ((__extent_storage<18446744073709551615UL> *)
                          &(this_01->super_Expression).syntax)->_M_extent_value;
            if ((initialExpr->super_SyntaxNode).kind == ClockingPropertyExpr) {
              cVar10 = (*(code *)(compilation->super_BumpAllocator).head[1].current)
                                 (compilation,lVar26);
              if (cVar10 == '\0') {
                pSVar21 = slang::syntax::TokenOrSyntax::node(this_02);
                SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
                ASTContext::addDiag(&argContext,(DiagCode)0x9e0007,SVar36);
                pCVar24 = (CallExpression *)0x0;
                this_01 = (CallExpression *)
                          Expression::badExpr((Compilation *)this,(Expression *)0x0);
                goto LAB_003c570a;
              }
              pEVar16 = ClockingEventExpression::fromSyntax
                                  ((ClockingEventExpression *)
                                   ((__extent_storage<18446744073709551615UL> *)
                                   &(this_01->super_Expression).syntax)->_M_extent_value,
                                   (ClockingPropertyExprSyntax *)&argContext,argContext_00);
              iteratorName._M_len = (size_t)pEVar16;
              pCVar24 = (CallExpression *)&iteratorName;
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,
                         (Expression **)pCVar24);
            }
            else {
              pEVar18 = ASTContext::requireSimpleExpr((ASTContext *)withClause,initialExpr);
              if (pEVar18 == (ExpressionSyntax *)0x0) {
                pCVar24 = (CallExpression *)0x0;
                this_01 = (CallExpression *)
                          Expression::badExpr((Compilation *)this,(Expression *)0x0);
                goto LAB_003c570a;
              }
              iteratorName._M_str =
                   (char *)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len;
              iteratorName._M_len =
                   (size_t)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
              sVar19 = (*(code *)(compilation->super_BumpAllocator).head[2].current)
                                 (compilation,lVar26,&argContext,pEVar18,&iteratorName);
              indexMethodName._M_len = sVar19;
              pCVar24 = (CallExpression *)&indexMethodName;
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,
                         (Expression **)pCVar24);
            }
          }
          this_02 = this_02 + 2;
        }
      }
      bVar11 = true;
      if (syntax != (InvocationExpressionSyntax *)0x0) {
        if (iteratorTok._0_8_ == 0) {
          ppEVar1 = buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ +
                    buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len;
          for (ppEVar30 = buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
              ppEVar30 != ppEVar1; ppEVar30 = ppEVar30 + 1) {
            pSVar14 = Expression::getSymbolReference(*ppEVar30,true);
            indexMethodName._M_len = (size_t)pSVar14;
            if (pSVar14 != (Symbol *)0x0) {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = pSVar14;
              hash = SUB168(auVar37 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar37 * ZEXT816(0x9e3779b97f4a7c15),0);
              pos0 = hash >> (local_178[0] & 0x3f);
              uVar2 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[hash & 0xff];
              SVar22 = (SourceLocation)0x0;
              uVar29 = pos0;
              do {
                pcVar25 = (char *)(local_178._16_8_ + uVar29 * 0x10);
                local_48 = *pcVar25;
                cStack_47 = pcVar25[1];
                cStack_46 = pcVar25[2];
                bStack_45 = pcVar25[3];
                cStack_44 = pcVar25[4];
                cStack_43 = pcVar25[5];
                cStack_42 = pcVar25[6];
                bStack_41 = pcVar25[7];
                cStack_40 = pcVar25[8];
                cStack_3f = pcVar25[9];
                cStack_3e = pcVar25[10];
                bStack_3d = pcVar25[0xb];
                cStack_3c = pcVar25[0xc];
                cStack_3b = pcVar25[0xd];
                cStack_3a = pcVar25[0xe];
                bStack_39 = pcVar25[0xf];
                cVar10 = (char)uVar2;
                auVar35[0] = -(local_48 == cVar10);
                cVar32 = (char)((uint)uVar2 >> 8);
                auVar35[1] = -(cStack_47 == cVar32);
                cVar33 = (char)((uint)uVar2 >> 0x10);
                auVar35[2] = -(cStack_46 == cVar33);
                bVar34 = (byte)((uint)uVar2 >> 0x18);
                auVar35[3] = -(bStack_45 == bVar34);
                auVar35[4] = -(cStack_44 == cVar10);
                auVar35[5] = -(cStack_43 == cVar32);
                auVar35[6] = -(cStack_42 == cVar33);
                auVar35[7] = -(bStack_41 == bVar34);
                auVar35[8] = -(cStack_40 == cVar10);
                auVar35[9] = -(cStack_3f == cVar32);
                auVar35[10] = -(cStack_3e == cVar33);
                auVar35[0xb] = -(bStack_3d == bVar34);
                auVar35[0xc] = -(cStack_3c == cVar10);
                auVar35[0xd] = -(cStack_3b == cVar32);
                auVar35[0xe] = -(cStack_3a == cVar33);
                auVar35[0xf] = -(bStack_39 == bVar34);
                uVar8 = (ushort)(SUB161(auVar35 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe;
                if (uVar8 != 0) {
                  uVar31 = (uint)uVar8;
                  do {
                    uVar7 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                      }
                    }
                    if (pSVar14 == *(Symbol **)(local_178._24_8_ + uVar29 * 0x78 + (ulong)uVar7 * 8)
                       ) goto LAB_003c5c21;
                    uVar31 = uVar31 - 1 & uVar31;
                  } while (uVar31 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0)
                break;
                lVar27 = uVar29 + (long)SVar22;
                SVar22 = (SourceLocation)((long)SVar22 + 1);
                uVar29 = lVar27 + 1U & local_178._8_8_;
              } while ((ulong)SVar22 <= (ulong)local_178._8_8_);
              if ((ulong)local_178._40_8_ < (ulong)local_178._32_8_) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                ::unchecked_emplace_at<slang::ast::Symbol_const*&>
                          ((locator *)&iteratorName,
                           (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                            *)local_178,pos0,hash,(Symbol **)&indexMethodName);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                          ((locator *)&iteratorName,
                           (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                            *)local_178,hash,(Symbol **)&indexMethodName);
              }
            }
LAB_003c5c21:
          }
        }
        this_01 = (CallExpression *)
                  std::
                  get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                            ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                              *)local_68);
        pCVar24 = (CallExpression *)&argContext;
        iVar12 = Constraint::bind((int)(syntax->attributes).super_SyntaxListBase.super_SyntaxNode.
                                       previewNode,(sockaddr *)pCVar24,__len);
        *(Scope **)&this_01->super_Expression = (Scope *)CONCAT44(extraout_var_00,iVar12);
        bVar11 = true;
      }
    }
    else {
      if ((compilation->options).maxRecursiveClassSpecialization == 2) {
        if ((syntax->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode !=
            (SyntaxNode *)0x0) {
          indexMethodName._M_len = 0;
          indexMethodName._M_str = (char *)0x0;
          pSVar21 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
          if (pSVar21 == (SyntaxNode *)0x0) {
LAB_003c5784:
            pCVar24 = (CallExpression *)&indexMethodName;
            std::
            variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
            ::operator=((variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         *)local_68,(RandomizeCallInfo *)pCVar24);
            goto LAB_003c5796;
          }
          if ((argContext.randomizeDetails != (RandomizeDetails *)0x0) &&
             ((argContext.randomizeDetails)->classType != (Scope *)0x0)) {
            iteratorName._M_str = (char *)0x0;
            iteratorName._M_len = (size_t)local_118;
            this_01 = (CallExpression *)&getId;
            local_1a0.ptr = (Type *)0x0;
            pSVar20 = pSVar21[3].previewNode;
            getId.context = (ASTContext *)&pSVar21[1].previewNode;
            for (; (getId.context != (ASTContext *)&pSVar21[1].previewNode ||
                   (local_1a0.ptr != (Type *)((ulong)((long)&pSVar20->kind + 1) >> 1)));
                local_1a0.ptr = (Type *)((long)&((local_1a0.ptr)->super_Symbol).kind + 1)) {
              this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                         iterator_base<slang::syntax::ExpressionSyntax_*>::dereference
                                   ((iterator_base<slang::syntax::ExpressionSyntax_*> *)this_01)->
                         super_SyntaxNode;
              if (this_00->kind == IdentifierName) {
                _iteratorLoc = parsing::Token::valueText((Token *)(this_00 + 1));
                SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                          ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)
                           &iteratorName,
                           (basic_string_view<char,_std::char_traits<char>_> *)&iteratorLoc);
                src = extraout_RDX_01;
              }
              else {
                SVar36 = slang::syntax::SyntaxNode::sourceRange(this_00);
                ASTContext::addDiag(&argContext,(DiagCode)0x410005,SVar36);
                src = extraout_RDX_02;
              }
            }
            dst = (argContext.scope.ptr)->compilation;
            iVar12 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::copy
                               ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 *)&iteratorName,(EVP_PKEY_CTX *)dst,src);
            sVar38 = indexMethodName;
            indexMethodName._M_str._4_4_ = extraout_var;
            indexMethodName._M_str._0_4_ = iVar12;
            indexMethodName._M_len = sVar38._M_len;
            SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
                      ((SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       &iteratorName,(EVP_PKEY_CTX *)dst);
            goto LAB_003c5784;
          }
          SVar36 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
          ASTContext::addDiag(&argContext,(DiagCode)0x780007,SVar36);
          pCVar24 = (CallExpression *)0x0;
          this_01 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0);
          bVar11 = false;
          goto LAB_003c597e;
        }
        SVar36 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(&argContext,(DiagCode)0x6d0007,SVar36);
      }
      else {
        SVar36 = parsing::Token::range((Token *)&syntax->attributes);
        pDVar15 = ASTContext::addDiag(&argContext,(DiagCode)0xad0007,SVar36);
        Diagnostic::operator<<(pDVar15,(string *)&(compilation->super_BumpAllocator).endPtr);
      }
      pCVar24 = (CallExpression *)0x0;
      this_01 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0);
LAB_003c570a:
      bVar11 = false;
    }
LAB_003c597e:
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                   *)local_178);
    if (!bVar11) goto LAB_003c5c70;
  }
LAB_003c5994:
  iteratorTok.info = (Info *)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len;
  iteratorTok._0_8_ = buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
  auVar37 = (*(code *)(compilation->super_BumpAllocator).head[3].current)
                      (compilation,withClause,&iteratorTok,range.startLoc,range.endLoc,local_1f0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = iteratorName._M_str;
  iteratorName = (string_view)(auVar9 << 0x40);
  iVar12 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                     (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,
                      (EVP_PKEY_CTX *)this,auVar37._8_8_);
  iteratorTok.rawLen = extraout_var_01;
  iteratorTok.kind = (short)iVar12;
  iteratorTok._2_1_ = (char)((uint)iVar12 >> 0x10);
  iteratorTok.numFlags.raw = (char)((uint)iVar12 >> 0x18);
  SVar22 = (SourceLocation)&iteratorTok;
  iteratorTok.info = extraout_RDX_03;
  argContext._0_12_ = *(undefined1 (*) [12])&(withClause->super_ExpressionSyntax).super_SyntaxNode;
  this_01 = BumpAllocator::
            emplace<slang::ast::CallExpression,slang::ast::CallExpression::SystemCallInfo&,slang::ast::Type_const&,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                      ((BumpAllocator *)this,(SystemCallInfo *)local_78,auVar37._0_8_,
                       (void **)&iteratorName,
                       (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)SVar22,
                       (LookupLocation *)&argContext,&range);
  bVar11 = Type::isError(auVar37._0_8_);
  pCVar24 = this_01;
  if (bVar11) {
    this_01 = (CallExpression *)Expression::badExpr((Compilation *)this,&this_01->super_Expression);
  }
  else {
    ppEVar5 = (this_01->arguments_)._M_ptr;
    sVar19 = (this_01->arguments_)._M_extent._M_extent_value;
    lVar27 = 0;
    do {
      if (sVar19 << 3 == lVar27) {
        pCVar24 = (CallExpression *)(ulong)(byte)(compilation->options).maxInstanceArray;
        SVar36.endLoc = SVar22;
        SVar36.startLoc = range.endLoc;
        bVar11 = checkOutputArgs((ast *)withClause,(ASTContext *)pCVar24,range.startLoc._0_1_,SVar36
                                );
        if (bVar11) {
          if (firstArg != (Expression *)0x0) {
            syntax_00._M_ptr = (pointer)firstArg[1].syntax;
            syntax_00._M_extent._M_extent_value = *(size_t *)&firstArg[1].sourceRange.startLoc;
            pCVar24 = this_01;
            ASTContext::setAttributes((ASTContext *)withClause,&this_01->super_Expression,syntax_00)
            ;
          }
        }
        else {
          pCVar24 = this_01;
          this_01 = (CallExpression *)
                    Expression::badExpr((Compilation *)this,&this_01->super_Expression);
        }
        goto LAB_003c5c70;
      }
      bVar11 = Expression::bad(*(Expression **)((long)ppEVar5 + lVar27));
      lVar27 = lVar27 + 8;
    } while (!bVar11);
    this_01 = (CallExpression *)Expression::badExpr((Compilation *)this,&this_01->super_Expression);
  }
LAB_003c5c70:
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)pCVar24);
  return &this_01->super_Expression;
}

Assistant:

Expression& CallExpression::createSystemCall(
    Compilation& compilation, const SystemSubroutine& subroutine, const Expression* firstArg,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, SourceRange range,
    const ASTContext& context, const Scope* randomizeScope) {

    SystemCallInfo callInfo{&subroutine, context.scope, {}};
    SmallVector<const Expression*> buffer;
    if (firstArg)
        buffer.push_back(firstArg);

    const Expression* iterOrThis = nullptr;
    const ValueSymbol* iterVar = nullptr;
    using WithClauseMode = SystemSubroutine::WithClauseMode;
    if (subroutine.withClauseMode == WithClauseMode::Iterator) {
        // 'with' clause is not required. If it's not there, no arguments
        // can be provided.
        if (!withClause) {
            if (syntax && syntax->arguments && !syntax->arguments->parameters.empty()) {
                context.addDiag(diag::IteratorArgsWithoutWithClause,
                                syntax->arguments->sourceRange())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }
        else if (firstArg) {
            iterOrThis = bindIteratorExpr(compilation, subroutine.name, syntax, *withClause,
                                          *firstArg->type, context, iterVar);
            if (!iterOrThis || iterOrThis->bad())
                return badExpr(compilation, iterOrThis);

            callInfo.extraInfo = IteratorCallInfo{iterOrThis, iterVar};
        }
    }
    else {
        ASTContext::RandomizeDetails randomizeDetails;
        ASTContext argContext = context.resetFlags({});

        if (subroutine.withClauseMode == WithClauseMode::Randomize) {
            // If this is a class-scoped randomize call, setup the scope properly
            // so that class members can be found in the constraint block.
            argContext.randomizeDetails = &randomizeDetails;
            if (firstArg) {
                randomizeDetails.classType = &firstArg->type->getCanonicalType().as<ClassType>();
                randomizeDetails.thisVar = firstArg->getSymbolReference();
            }
            else if (randomizeScope && randomizeScope->asSymbol().kind == SymbolKind::ClassType) {
                randomizeDetails.classType = randomizeScope;
            }
            iterOrThis = firstArg;
        }

        if (withClause) {
            if (subroutine.withClauseMode == WithClauseMode::Randomize) {
                if (!withClause->constraints) {
                    argContext.addDiag(diag::MissingConstraintBlock, withClause->sourceRange());
                    return badExpr(compilation, nullptr);
                }

                RandomizeCallInfo randInfo;
                if (withClause->args) {
                    if (!argContext.randomizeDetails || !argContext.randomizeDetails->classType) {
                        argContext.addDiag(diag::NameListWithScopeRandomize,
                                           withClause->args->sourceRange());
                        return badExpr(compilation, nullptr);
                    }

                    SmallVector<std::string_view> names;
                    for (auto expr : withClause->args->expressions) {
                        if (expr->kind != SyntaxKind::IdentifierName) {
                            argContext.addDiag(diag::ExpectedIdentifier, expr->sourceRange());
                            continue;
                        }

                        names.push_back(expr->as<IdentifierNameSyntax>().identifier.valueText());
                    }

                    randInfo.constraintRestrictions = names.copy(argContext.getCompilation());
                }

                callInfo.extraInfo = randInfo;
            }
            else {
                argContext.addDiag(diag::WithClauseNotAllowed, withClause->with.range())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }

        // Bind arguments as we would for any ordinary method.
        if (syntax && syntax->arguments) {
            auto actualArgs = syntax->arguments->parameters;
            for (size_t i = 0; i < actualArgs.size(); i++) {
                size_t index = i + (firstArg ? 1 : 0);
                switch (actualArgs[i]->kind) {
                    case SyntaxKind::OrderedArgument: {
                        const auto& arg = actualArgs[i]->as<OrderedArgumentSyntax>();
                        if (arg.expr->kind == SyntaxKind::ClockingPropertyExpr) {
                            if (subroutine.allowClockingArgument(index)) {
                                buffer.push_back(&ClockingEventExpression::fromSyntax(
                                    arg.expr->as<ClockingPropertyExprSyntax>(), argContext));
                            }
                            else {
                                argContext.addDiag(diag::TimingControlNotAllowed,
                                                   actualArgs[i]->sourceRange());
                                return badExpr(compilation, nullptr);
                            }
                        }
                        else if (auto exSyn = context.requireSimpleExpr(*arg.expr)) {
                            buffer.push_back(
                                &subroutine.bindArgument(index, argContext, *exSyn, buffer));
                        }
                        else {
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    }
                    case SyntaxKind::NamedArgument:
                        argContext.addDiag(diag::NamedArgNotAllowed, actualArgs[i]->sourceRange());
                        return badExpr(compilation, nullptr);
                    case SyntaxKind::EmptyArgument:
                        if (subroutine.allowEmptyArgument(index)) {
                            buffer.push_back(compilation.emplace<EmptyArgumentExpression>(
                                compilation.getVoidType(), actualArgs[i]->sourceRange()));
                        }
                        else {
                            argContext.addDiag(diag::EmptyArgNotAllowed,
                                               actualArgs[i]->sourceRange());
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
        }

        if (withClause) {
            // Finally bind the inline constraint block if we have one.
            SLANG_ASSERT(withClause->constraints);

            // For scope randomize calls we need to register the
            // arg variables so they get treated as 'rand'.
            if (!randomizeDetails.classType) {
                for (auto arg : buffer) {
                    auto sym = arg->getSymbolReference();
                    if (sym)
                        randomizeDetails.scopeRandVars.emplace(sym);
                }
            }

            auto& randInfo = std::get<2>(callInfo.extraInfo);
            randomizeDetails.nameRestrictions = randInfo.constraintRestrictions;
            randInfo.inlineConstraints = &Constraint::bind(*withClause->constraints, argContext);
        }
    }

    const Type& type = subroutine.checkArguments(context, buffer, range, iterOrThis);
    auto expr = compilation.emplace<CallExpression>(callInfo, type, nullptr,
                                                    buffer.copy(compilation), context.getLocation(),
                                                    range);

    if (type.isError())
        return badExpr(compilation, expr);

    for (auto arg : expr->arguments()) {
        if (arg->bad())
            return badExpr(compilation, expr);
    }

    if (!checkOutputArgs(context, subroutine.hasOutputArgs, range))
        return badExpr(compilation, expr);

    if (syntax)
        context.setAttributes(*expr, syntax->attributes);

    return *expr;
}